

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeFinalize(Vdbe *p)

{
  int local_14;
  int rc;
  Vdbe *p_local;
  
  local_14 = 0;
  if ((p->magic == 0x2df20da3) || (p->magic == 0x319c2973)) {
    local_14 = sqlite3VdbeReset(p);
  }
  sqlite3VdbeDelete(p);
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFinalize(Vdbe *p){
  int rc = SQLITE_OK;
  if( p->magic==VDBE_MAGIC_RUN || p->magic==VDBE_MAGIC_HALT ){
    rc = sqlite3VdbeReset(p);
    assert( (rc & p->db->errMask)==rc );
  }
  sqlite3VdbeDelete(p);
  return rc;
}